

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O0

TableResource * table_open(SRBRoot *bundle,char *tag,UString *comment,UErrorCode *status)

{
  UBool UVar1;
  TableResource *this;
  TableResource *local_60;
  LocalPointerBase<TableResource> local_30;
  LocalPointer<TableResource> res;
  UErrorCode *status_local;
  UString *comment_local;
  char *tag_local;
  SRBRoot *bundle_local;
  
  res.super_LocalPointerBase<TableResource>.ptr =
       (LocalPointerBase<TableResource>)(LocalPointerBase<TableResource>)status;
  this = (TableResource *)operator_new(0x58);
  TableResource::TableResource
            (this,bundle,tag,comment,(UErrorCode *)res.super_LocalPointerBase<TableResource>.ptr);
  icu_63::LocalPointer<TableResource>::LocalPointer
            ((LocalPointer<TableResource> *)&local_30,this,
             (UErrorCode *)res.super_LocalPointerBase<TableResource>.ptr);
  UVar1 = U_SUCCESS(*(UErrorCode *)res.super_LocalPointerBase<TableResource>.ptr);
  if (UVar1 == '\0') {
    local_60 = (TableResource *)0x0;
  }
  else {
    local_60 = icu_63::LocalPointerBase<TableResource>::orphan(&local_30);
  }
  icu_63::LocalPointer<TableResource>::~LocalPointer((LocalPointer<TableResource> *)&local_30);
  return local_60;
}

Assistant:

TableResource* table_open(struct SRBRoot *bundle, const char *tag, const struct UString* comment, UErrorCode *status) {
    LocalPointer<TableResource> res(new TableResource(bundle, tag, comment, *status), *status);
    return U_SUCCESS(*status) ? res.orphan() : NULL;
}